

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall IDLExport::save(IDLExport *this,ostream *stream,RegistryIterator *type)

{
  bool bVar1;
  RegistryIterator *stream_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  size_type sVar6;
  pointer ppVar7;
  UnsupportedType *this_00;
  long lVar8;
  Type *pTVar9;
  mapped_type *this_01;
  ulong uVar10;
  ostream *poVar11;
  Registry *registry;
  reference pTVar12;
  bool local_98d;
  bool local_8c1;
  bool local_8b1;
  string local_890;
  undefined1 local_870 [8];
  string result;
  IDLExportVisitor exporter;
  allocator local_659;
  string local_658 [8];
  string indent_string;
  size_t ns_size;
  undefined1 local_610 [8];
  string target_namespace;
  string def;
  string local_5b0;
  string local_590;
  long local_570;
  Container *container_t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_540;
  long local_520;
  Array *array_t;
  undefined1 local_4f8 [8];
  string base_name;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  iterator local_450;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>
  local_448;
  string local_440;
  iterator local_420;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>
  local_418;
  const_iterator already_exported;
  undefined1 local_3f0 [8];
  string type_namespace;
  ostringstream stream_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  byte local_209;
  string local_208;
  byte local_1e2;
  byte local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  byte local_199;
  string local_198;
  byte local_172;
  byte local_171;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  byte local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  byte local_102;
  byte local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  key_type local_48;
  iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
  *local_28;
  RegistryIterator *type_local;
  ostream *stream_local;
  IDLExport *this_local;
  
  local_28 = (iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
              *)type;
  type_local = (RegistryIterator *)stream;
  stream_local = (ostream *)this;
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_selected_types);
  if (!bVar2) {
    boost::iterators::detail::
    iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
    ::operator->(local_28);
    Typelib::Type::getName_abi_cxx11_();
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->m_selected_types,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (sVar6 == 0) {
      this_local._7_1_ = 0;
      goto LAB_0013a9fe;
    }
  }
  bVar2 = Typelib::RegistryIterator::isAlias((RegistryIterator *)local_28);
  if (bVar2) {
    boost::iterators::detail::
    iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
    ::operator->(local_28);
    Typelib::Type::getNamespace_abi_cxx11_();
    local_b9 = 0;
    local_101 = 0;
    local_102 = 0;
    local_129 = 0;
    local_171 = 0;
    local_172 = 0;
    local_199 = 0;
    local_1e1 = 0;
    local_1e2 = 0;
    local_209 = 0;
    bVar1 = false;
    bVar2 = false;
    Typelib::RegistryIterator::getNamespace_abi_cxx11_(&local_98,(RegistryIterator *)local_28);
    bVar3 = std::operator!=(&local_78,&local_98);
    local_8b1 = true;
    if (!bVar3) {
      boost::iterators::detail::
      iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
      ::operator->(local_28);
      Typelib::Type::getBasename_abi_cxx11_();
      local_b9 = 1;
      Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_100,(RegistryIterator *)local_28);
      local_101 = 1;
      std::operator+(&local_e0,"struct ",&local_100);
      local_102 = 1;
      bVar3 = std::operator!=(&local_b8,&local_e0);
      local_8c1 = false;
      if (bVar3) {
        boost::iterators::detail::
        iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
        ::operator->(local_28);
        Typelib::Type::getBasename_abi_cxx11_();
        local_129 = 1;
        Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_170,(RegistryIterator *)local_28);
        local_171 = 1;
        std::operator+(&local_150,"enum ",&local_170);
        local_172 = 1;
        bVar3 = std::operator!=(&local_128,&local_150);
        local_8c1 = false;
        if (bVar3) {
          Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_198,(RegistryIterator *)local_28)
          ;
          local_199 = 1;
          boost::iterators::detail::
          iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
          ::operator->(local_28);
          Typelib::Type::getBasename_abi_cxx11_();
          local_1e1 = 1;
          std::operator+(&local_1c0,"struct ",&local_1e0);
          local_1e2 = 1;
          bVar3 = std::operator!=(&local_198,&local_1c0);
          local_8c1 = false;
          if (bVar3) {
            Typelib::RegistryIterator::getBasename_abi_cxx11_
                      (&local_208,(RegistryIterator *)local_28);
            local_209 = 1;
            boost::iterators::detail::
            iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
            ::operator->(local_28);
            Typelib::Type::getBasename_abi_cxx11_();
            bVar1 = true;
            std::operator+(&local_230,"enum ",&local_250);
            bVar2 = true;
            local_8c1 = std::operator!=(&local_208,&local_230);
          }
        }
      }
      local_8b1 = local_8c1;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_230);
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_250);
    }
    if ((local_209 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_208);
    }
    if ((local_1e2 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    if ((local_1e1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    if ((local_199 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_198);
    }
    if ((local_172 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    if ((local_171 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_170);
    }
    if ((local_129 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_128);
    }
    if ((local_102 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if ((local_101 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_100);
    }
    if ((local_b9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    if (local_8b1 == false) {
      this_local._7_1_ = 0;
    }
    else {
      pTVar12 = boost::iterators::detail::
                iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                ::operator*(local_28);
      checkType(pTVar12);
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)(type_namespace.field_2._M_local_buf + 8));
      Typelib::RegistryIterator::getNamespace_abi_cxx11_
                ((string *)&already_exported,(RegistryIterator *)local_28);
      anon_unknown.dwarf_1785d::getIDLAbsoluteNamespace
                ((string *)local_3f0,(string *)&already_exported,this);
      std::__cxx11::string::~string((string *)&already_exported);
      Typelib::RegistryIterator::getName_abi_cxx11_(&local_440,(RegistryIterator *)local_28);
      local_420._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
           ::find(&this->m_exported_typedefs,&local_440);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>
      ::_Rb_tree_const_iterator(&local_418,&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      local_450._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
           ::end(&this->m_exported_typedefs);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>
      ::_Rb_tree_const_iterator(&local_448,&local_450);
      bVar2 = std::operator!=(&local_418,&local_448);
      if (bVar2) {
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>
                 ::operator->(&local_418);
        pTVar9 = ppVar7->second;
        pTVar12 = boost::iterators::detail::
                  iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                  ::operator*(local_28);
        bVar4 = Typelib::Type::operator!=(pTVar9,pTVar12);
        if ((bVar4 & 1) != 0) {
          this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
          pTVar12 = boost::iterators::detail::
                    iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                    ::operator*(local_28);
          Typelib::RegistryIterator::getName_abi_cxx11_(&local_4b0,(RegistryIterator *)local_28);
          std::operator+(&local_490,"the typedef name ",&local_4b0);
          std::operator+(&local_470,&local_490," is reserved by the IDL exporter");
          Typelib::UnsupportedType::UnsupportedType(this_00,pTVar12,&local_470);
          __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,
                      Typelib::UnsupportedType::~UnsupportedType);
        }
        this_local._7_1_ = 0;
      }
      else {
        Typelib::RegistryIterator::getBasename_abi_cxx11_
                  ((string *)((long)&base_name.field_2 + 8),(RegistryIterator *)local_28);
        lVar8 = std::__cxx11::string::find_first_of(base_name.field_2._M_local_buf + 8,0x15317e);
        std::__cxx11::string::~string((string *)(base_name.field_2._M_local_buf + 8));
        if (lVar8 == -1) {
          Typelib::RegistryIterator::getBasename_abi_cxx11_
                    ((string *)&array_t,(RegistryIterator *)local_28);
          anon_unknown.dwarf_1785d::stripLeadingUnderscore((string *)local_4f8,(string *)&array_t);
          std::__cxx11::string::~string((string *)&array_t);
          boost::iterators::detail::
          iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
          ::operator->(local_28);
          iVar5 = Typelib::Type::getCategory();
          if (iVar5 == 1) {
            pTVar12 = boost::iterators::detail::
                      iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                      ::operator*(local_28);
            local_520 = __dynamic_cast(pTVar12,&Typelib::Type::typeinfo,&Typelib::Array::typeinfo,0)
            ;
            if (local_520 == 0) {
              __cxa_bad_cast();
            }
            pTVar9 = (Type *)Typelib::Indirect::getIndirection();
            getIDLAbsolute_abi_cxx11_(&local_540,this,pTVar9);
            poVar11 = std::operator<<((ostream *)(type_namespace.field_2._M_local_buf + 8),
                                      (string *)&local_540);
            poVar11 = std::operator<<(poVar11," ");
            poVar11 = std::operator<<(poVar11,(string *)local_4f8);
            poVar11 = std::operator<<(poVar11,"[");
            uVar10 = Typelib::Array::getDimension();
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar10);
            std::operator<<(poVar11,"];");
            std::__cxx11::string::~string((string *)&local_540);
          }
          else {
            container_t._7_1_ = 0;
            boost::iterators::detail::
            iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
            ::operator->(local_28);
            iVar5 = Typelib::Type::getCategory();
            local_98d = false;
            if (iVar5 == 7) {
              boost::iterators::detail::
              iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
              ::operator->(local_28);
              Typelib::Type::getName_abi_cxx11_();
              container_t._7_1_ = 1;
              local_98d = std::operator!=(&local_560,"/std/string");
            }
            if ((container_t._7_1_ & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_560);
            }
            if (local_98d == false) {
              boost::iterators::detail::
              iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
              ::operator->(local_28);
              iVar5 = Typelib::Type::getCategory();
              if (iVar5 == 6) {
                bVar2 = marshalOpaquesAsAny(this);
                if (bVar2) {
                  poVar11 = std::operator<<((ostream *)(type_namespace.field_2._M_local_buf + 8),
                                            "any ");
                  poVar11 = std::operator<<(poVar11,(string *)local_4f8);
                  std::operator<<(poVar11,";");
                }
              }
              else {
                Typelib::RegistryIterator::getBasename_abi_cxx11_
                          (&local_5b0,(RegistryIterator *)local_28);
                lVar8 = std::__cxx11::string::find_first_of((char *)&local_5b0,0x1530ea);
                std::__cxx11::string::~string((string *)&local_5b0);
                if (lVar8 == -1) {
                  pTVar12 = boost::iterators::detail::
                            iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                            ::operator*(local_28);
                  getIDLAbsolute_abi_cxx11_((string *)((long)&def.field_2 + 8),this,pTVar12);
                  poVar11 = std::operator<<((ostream *)(type_namespace.field_2._M_local_buf + 8),
                                            (string *)(def.field_2._M_local_buf + 8));
                  poVar11 = std::operator<<(poVar11," ");
                  poVar11 = std::operator<<(poVar11,(string *)local_4f8);
                  std::operator<<(poVar11,";");
                  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
                }
              }
            }
            else {
              pTVar12 = boost::iterators::detail::
                        iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                        ::operator*(local_28);
              local_570 = __dynamic_cast(pTVar12,&Typelib::Type::typeinfo,
                                         &Typelib::Container::typeinfo,0);
              if (local_570 == 0) {
                __cxa_bad_cast();
              }
              poVar11 = std::operator<<((ostream *)(type_namespace.field_2._M_local_buf + 8),
                                        "sequence<");
              pTVar9 = (Type *)Typelib::Indirect::getIndirection();
              getIDLAbsolute_abi_cxx11_(&local_590,this,pTVar9);
              poVar11 = std::operator<<(poVar11,(string *)&local_590);
              poVar11 = std::operator<<(poVar11,"> ");
              poVar11 = std::operator<<(poVar11,(string *)local_4f8);
              std::operator<<(poVar11,";");
              std::__cxx11::string::~string((string *)&local_590);
            }
          }
          std::__cxx11::ostringstream::str();
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&this->m_typedefs,(key_type *)local_3f0);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_01,(value_type *)((long)&target_namespace.field_2 + 8));
          }
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)(target_namespace.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_4f8);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)local_3f0);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(type_namespace.field_2._M_local_buf + 8));
    }
  }
  else {
    if (this->m_blob_threshold != 0) {
      boost::iterators::detail::
      iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
      ::operator->(local_28);
      iVar5 = Typelib::Type::getSize();
      if (this->m_blob_threshold < iVar5) {
        Typelib::RegistryIterator::getNamespace_abi_cxx11_
                  ((string *)&ns_size,(RegistryIterator *)local_28);
        anon_unknown.dwarf_1785d::getIDLAbsoluteNamespace
                  ((string *)local_610,(string *)&ns_size,this);
        std::__cxx11::string::~string((string *)&ns_size);
        indent_string.field_2._8_8_ =
             anon_unknown.dwarf_1785d::namespaceIndentLevel((string *)local_610);
        uVar10 = indent_string.field_2._8_8_ << 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_658,uVar10,' ',&local_659);
        std::allocator<char>::~allocator((allocator<char> *)&local_659);
        adaptNamespace(this,(ostream *)type_local,(string *)local_610);
        poVar11 = std::operator<<((ostream *)type_local,local_658);
        poVar11 = std::operator<<(poVar11,"typedef sequence<octet> ");
        boost::iterators::detail::
        iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
        ::operator->(local_28);
        Typelib::Type::getBasename_abi_cxx11_();
        poVar11 = std::operator<<(poVar11,(string *)&exporter.m_exported_typedefs);
        std::operator<<(poVar11,";\n");
        std::__cxx11::string::~string((string *)&exporter.m_exported_typedefs);
        this_local._7_1_ = 1;
        std::__cxx11::string::~string(local_658);
        std::__cxx11::string::~string((string *)local_610);
        goto LAB_0013a9fe;
      }
    }
    registry = Typelib::RegistryIterator::getRegistry((RegistryIterator *)local_28);
    anon_unknown.dwarf_1785d::IDLExportVisitor::IDLExportVisitor
              ((IDLExportVisitor *)((long)&result.field_2 + 8),registry,this,
               &this->m_exported_typedefs);
    pTVar12 = boost::iterators::detail::
              iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
              ::operator*(local_28);
    anon_unknown.dwarf_1785d::IDLExportVisitor::apply
              ((IDLExportVisitor *)((long)&result.field_2 + 8),pTVar12);
    (anonymous_namespace)::IDLExportVisitor::getResult_abi_cxx11_
              ((string *)local_870,(void *)((long)&result.field_2 + 8));
    uVar10 = std::__cxx11::string::empty();
    stream_00 = type_local;
    this_local._7_1_ = (uVar10 & 1) == 0;
    if ((bool)this_local._7_1_) {
      (anonymous_namespace)::IDLExportVisitor::getTargetNamespace_abi_cxx11_
                (&local_890,(void *)((long)&result.field_2 + 8));
      adaptNamespace(this,(ostream *)stream_00,&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      std::operator<<((ostream *)type_local,(string *)local_870);
    }
    std::__cxx11::string::~string((string *)local_870);
    anon_unknown.dwarf_1785d::IDLExportVisitor::~IDLExportVisitor
              ((IDLExportVisitor *)((long)&result.field_2 + 8));
  }
LAB_0013a9fe:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IDLExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (! m_selected_types.empty())
    {
        if (m_selected_types.count(type->getName()) == 0)
        {
            return false;
        }
    }

    if (type.isAlias())
    {
        // IDL has C++-like rules for struct and enums. Do not alias a "struct A" to "A";
        if (type->getNamespace() != type.getNamespace()
                || (type->getBasename() != "struct " + type.getBasename()
                    && type->getBasename() != "enum " + type.getBasename()
                    && type.getBasename() != "struct " + type->getBasename()
                    && type.getBasename() != "enum " + type->getBasename()))
        {
            IDLExport::checkType(*type);
            ostringstream stream;

            std::string type_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);

            map<string, Type const*>::const_iterator already_exported =
                m_exported_typedefs.find(type.getName());
            if (already_exported != m_exported_typedefs.end())
            {
                if (*already_exported->second != *type)
                    throw UnsupportedType(*type, "the typedef name " + type.getName() + " is reserved by the IDL exporter");
                return false;
            }
            else if (type.getBasename().find_first_of("/<>") != std::string::npos)
            {
                return false;
            }

            std::string base_name = stripLeadingUnderscore(type.getBasename());

            // Alias types using typedef, taking into account that the aliased type
            // may not be in the same module than the new alias.
            if (type->getCategory() == Type::Array)
            {
                Array const& array_t = dynamic_cast<Array const&>(*type);
                stream
                    << getIDLAbsolute(array_t.getIndirection())
                    << " " << base_name << "[" << array_t.getDimension() << "];";
            }
            else if (type->getCategory() == Type::Container && type->getName() != "/std/string")
            {
                // Generate a sequence, regardless of the actual container type
                Container const& container_t = dynamic_cast<Container const&>(*type);
                stream << "sequence<" << getIDLAbsolute(container_t.getIndirection()) << "> " << base_name << ";";
            }
            else if (type->getCategory() == Type::Opaque)
            {
                if (marshalOpaquesAsAny())
                    stream << "any " << base_name << ";";
            }
            else if (type.getBasename().find_first_of(" ") == string::npos)
                stream << getIDLAbsolute(*type) << " " << base_name << ";";

            std::string def = stream.str();
            if (!def.empty())
                m_typedefs[type_namespace].push_back(def);
            return true;
        }
        else return false;
    }
    else
    {
        // Don't call adaptNamespace right now, since some types can be simply
        // ignored by the IDLExportVisitor -- resulting in an empty module,
        // which is not accepted in IDL
        //
        // Instead, act "as if" the namespace was changed, capturing the output
        // in a temporary ostringstream and change namespace only if some output
        // has actually been generated

        if (m_blob_threshold && static_cast<int>(type->getSize()) > m_blob_threshold)
        {
            string target_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);
            size_t ns_size = namespaceIndentLevel(target_namespace);
            string indent_string = string(ns_size * 4, ' ');

            adaptNamespace(stream, target_namespace);
            stream << indent_string << "typedef sequence<octet> " << type->getBasename() << ";\n";
            return true;
        }
        else
        {
            IDLExportVisitor exporter(type.getRegistry(), *this, m_exported_typedefs);
            exporter.apply(*type);

            string result = exporter.getResult();
            if (result.empty())
                return false;
            else
            {
                adaptNamespace(stream, exporter.getTargetNamespace());
                stream << result;
                return true;
            }
        }
    }
}